

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.cpp
# Opt level: O3

bool __thiscall ByteArray::toFile(ByteArray *this,path *fileName)

{
  char cVar1;
  bool bVar2;
  ofstream stream;
  undefined1 local_210 [32];
  byte abStack_1f0 [216];
  undefined8 local_118 [33];
  
  ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::basic_ofstream
            ((basic_ofstream<char,_std::char_traits<char>_> *)local_210,fileName,
             _S_trunc|_S_out|_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    bVar2 = false;
  }
  else {
    std::ostream::write(local_210,(long)this->data_);
    bVar2 = (abStack_1f0[(long)*(_func_int **)(local_210._0_8_ + -0x18)] & 5) == 0;
  }
  local_210._0_8_ =
       std::ofstream-in-ghc::filesystem::basic_ofstream<char,std::char_traits<char>>::
       construction_vtable + 0x18;
  local_118[0] = 0x1bc820;
  std::filebuf::~filebuf((filebuf *)(local_210 + 8));
  std::ios_base::~ios_base((ios_base *)local_118);
  return bVar2;
}

Assistant:

bool ByteArray::toFile(const fs::path& fileName)
{
	fs::ofstream stream(fileName, fs::fstream::out | fs::fstream::binary | fs::fstream::trunc);
	if (!stream.is_open())
		return {};

	stream.write(reinterpret_cast<const char *>(data_), size_);
	return !stream.fail();
}